

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Http.cpp
# Opt level: O1

void __thiscall asl::HttpMessage::readBody(HttpMessage *this)

{
  HttpSink *pHVar1;
  HttpStatus *pHVar2;
  SmartObject_ *pSVar3;
  _FuncB<void,_const_asl::HttpStatus_&,_asl::NoType> *p_Var4;
  bool bVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  int iVar15;
  byte buffer [16000];
  String local_3ed0;
  String local_3eb8 [667];
  
  String::String(&local_3ed0,"Content-Length");
  header(local_3eb8,this,&local_3ed0);
  uVar14 = local_3eb8[0].field_2._str;
  if (local_3eb8[0]._size == 0) {
    uVar14 = &local_3eb8[0].field_2;
  }
  uVar7 = myatoi((char *)uVar14);
  if (local_3eb8[0]._size != 0) {
    free((void *)local_3eb8[0].field_2._0_8_);
  }
  if (local_3ed0._size != 0) {
    free(local_3ed0.field_2._str);
  }
  String::String(&local_3ed0,"Transfer-Encoding");
  header(local_3eb8,this,&local_3ed0);
  uVar14 = local_3eb8[0].field_2._str;
  iVar15 = local_3eb8[0]._size;
  uVar13 = local_3eb8[0].field_2._str;
  if (local_3eb8[0]._size == 0) {
    uVar13 = &local_3eb8[0].field_2;
  }
  iVar8 = strcmp((char *)uVar13,"chunked");
  if (iVar15 != 0) {
    free((void *)uVar14);
  }
  if (local_3ed0._size != 0) {
    free(local_3ed0.field_2._str);
  }
  pHVar1 = ((this->_sink)._p)->p;
  (*pHVar1->_vptr_HttpSink[4])(pHVar1,(ulong)uVar7);
  (this->_socket->super_SmartObject)._p[3].field_0xc = 1;
  String::String(local_3eb8,"Content-Length");
  bVar6 = hasHeader(this,local_3eb8);
  if (local_3eb8[0]._size != 0) {
    free((void *)local_3eb8[0].field_2._0_8_);
  }
  if (bVar6) {
    String::String(&local_3ed0,"Content-Length");
    header(local_3eb8,this,&local_3ed0);
    uVar14 = local_3eb8[0].field_2._str;
    iVar15 = local_3eb8[0]._size;
    uVar13 = &local_3eb8[0].field_2;
    if (local_3eb8[0]._size != 0) {
      uVar13 = local_3eb8[0].field_2._str;
    }
    iVar9 = strcmp((char *)uVar13,"0");
    if (iVar15 != 0) {
      free((void *)uVar14);
    }
    if (local_3ed0._size != 0) {
      free(local_3ed0.field_2._str);
    }
    if (iVar9 == 0) {
      return;
    }
  }
  else if (iVar8 != 0) {
    return;
  }
  pHVar2 = ((this->_status)._p)->p;
  pHVar2->totalReceive = uVar7;
  pHVar2->received = 0;
  iVar15 = 0;
  bVar6 = false;
  do {
    if (bVar6) {
      return;
    }
    iVar9 = (*((this->_socket->super_SmartObject)._p)->_vptr_SmartObject_[0xc])();
    if ((iVar9 < 0) ||
       (iVar9 = (*((this->_socket->super_SmartObject)._p)->_vptr_SmartObject_[0xf])
                          (0x4024000000000000), (char)iVar9 == '\0')) {
      bVar5 = false;
    }
    else {
      uVar10 = (*((this->_socket->super_SmartObject)._p)->_vptr_SmartObject_[0xc])();
      if (iVar8 == 0) {
        Socket_::readLine(local_3eb8,(Socket_ *)(this->_socket->super_SmartObject)._p);
        uVar14 = &local_3eb8[0].field_2;
        if (local_3eb8[0]._size != 0) {
          uVar14 = local_3eb8[0].field_2._str;
        }
        uVar12 = strtoul((char *)uVar14,(char **)0x0,0x10);
        if ((int)uVar12 == 0) {
          bVar6 = true;
        }
        if (local_3eb8[0]._size != 0) {
          free((void *)local_3eb8[0].field_2._0_8_);
        }
      }
      else {
        uVar12 = (ulong)uVar10;
      }
      while (iVar9 = (int)uVar12, 0 < iVar9) {
        uVar12 = uVar12 & 0xffffffff;
        if (15999 < iVar9) {
          uVar12 = 16000;
        }
        pSVar3 = (this->_socket->super_SmartObject)._p;
        uVar11 = (*pSVar3->_vptr_SmartObject_[0xd])(pSVar3,local_3eb8,uVar12);
        uVar10 = uVar7;
        if ((int)uVar11 < 1) {
LAB_00123998:
          bVar5 = false;
          uVar7 = uVar10;
          goto LAB_001239a3;
        }
        iVar15 = iVar15 + uVar11;
        ((this->_status)._p)->p->received = iVar15;
        pHVar1 = ((this->_sink)._p)->p;
        (*pHVar1->_vptr_HttpSink[2])(pHVar1,local_3eb8,(ulong)uVar11);
        p_Var4 = (this->_progress).f;
        if (p_Var4 != (_FuncB<void,_const_asl::HttpStatus_&,_asl::NoType> *)0x0) {
          (**(code **)(*(long *)p_Var4 + 0x18))(p_Var4,((this->_status)._p)->p);
        }
        if (uVar7 == 0) {
          uVar7 = 0;
        }
        else {
          uVar10 = uVar7 - uVar11;
          bVar5 = (int)uVar7 < (int)uVar11;
          uVar7 = uVar10;
          if (uVar10 == 0 || bVar5) goto LAB_00123998;
        }
        uVar12 = (ulong)(iVar9 - uVar11);
      }
      if ((iVar8 == 0) &&
         (pSVar3 = (this->_socket->super_SmartObject)._p,
         iVar9 = (*pSVar3->_vptr_SmartObject_[0xd])(pSVar3,local_3eb8,2), iVar9 < 2)) {
        bVar5 = false;
      }
      else {
        bVar5 = true;
      }
    }
LAB_001239a3:
    if (!bVar5) {
      return;
    }
  } while( true );
}

Assistant:

void HttpMessage::readBody()
{
	int size = header("Content-Length");

	int currentsize = 0;

	bool chunked = header("Transfer-Encoding") == "chunked"; // Handle specially!!

	_sink->init(size);

	_socket->setBlocking(true);

	bool end = false;

	if (hasHeader("Content-Length")) {
		if (header("Content-Length") == "0")
			return;
	}
	else if(!chunked)
		return;

	_status->totalReceive = size;
	_status->received = 0;

	while (!end)
	{
		int av = _socket->available();
		if (av < 0 || !_socket->waitInput(10)) {
			break;
		}
		byte buffer[RECV_BLOCK_SIZE];
		int maxToRead = _socket->available(), bytesRead = 0;
		if (chunked)
		{
			String chunkSize = _socket->readLine();
			maxToRead = chunkSize.hexToInt();
			if (maxToRead == 0)
				end = true;
		}
		while (maxToRead > 0) {
			bytesRead = _socket->read(buffer, min(maxToRead, (int)sizeof(buffer)));
			if (bytesRead <= 0) {
				return;
			}
			currentsize += bytesRead;
			_status->received = currentsize;
			_sink->write(buffer, bytesRead);
			if(_progress)
				_progress(*_status);
			maxToRead -= bytesRead;
			if (size) {
				size -= bytesRead;
				if (size <= 0) {
					return;
				}
			}
		}
		//if (maxToRead == 0) // ANDROID ?
		//	break;

		if (chunked)
		{
			if (_socket->read(buffer, 2) < 2) // skip crlf
				break;
		}
	}
	//printf("readbody end\n");
}